

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status
filemgr_commit_bid(filemgr *file,bid_t bid,uint64_t bmp_revnum,bool sync,
                  err_log_callback *log_callback)

{
  pthread_spinlock_t *__lock;
  ushort uVar1;
  __int_type_conflict _Var2;
  kvs_header *pkVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  int64_t iVar11;
  fdb_status io_error;
  void *__dest;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  avl_node *node;
  avl_node *paVar20;
  bid_t start_bid;
  ulong uVar21;
  uint64_t uVar22;
  ulong uVar23;
  ulong uVar24;
  
  LOCK();
  (file->io_in_prog).super___atomic_base<unsigned_char>._M_i =
       (file->io_in_prog).super___atomic_base<unsigned_char>._M_i + '\x01';
  UNLOCK();
  _Var2 = (file->pos).super___atomic_base<unsigned_long>._M_i;
  if ((global_config.ncacheblock < 1) ||
     (io_error = bcache_flush(file), io_error == FDB_RESULT_SUCCESS)) {
    __lock = &file->lock;
    pthread_spin_lock(__lock);
    uVar1 = (file->header).size;
    uVar23 = (ulong)uVar1;
    if ((uVar23 != 0) && ((file->header).data != (void *)0x0)) {
      pkVar3 = file->kv_header;
      uVar21 = file->version;
      __dest = _filemgr_get_temp_buf();
      memcpy(__dest,(file->header).data,uVar23);
      uVar24 = (file->header).revnum;
      *(ulong *)((long)__dest + uVar23) =
           uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 | (uVar24 & 0xff0000000000) >> 0x18
           | (uVar24 & 0xff00000000) >> 8 | (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18
           | (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38;
      *(__int_type_conflict *)((long)__dest + uVar23 + 8) =
           (file->header).seqnum.super___atomic_base<unsigned_long>._M_i << 0x38 |
           ((file->header).seqnum.super___atomic_base<unsigned_long>._M_i & 0xff00) << 0x28 |
           ((file->header).seqnum.super___atomic_base<unsigned_long>._M_i & 0xff0000) << 0x18 |
           (ulong)((uint)(file->header).seqnum.super___atomic_base<unsigned_long>._M_i & 0xff000000)
           << 8 | (ulong)((uint)((file->header).seqnum.super___atomic_base<unsigned_long>._M_i >> 8)
                         & 0xff000000) |
                  (file->header).seqnum.super___atomic_base<unsigned_long>._M_i >> 0x18 & 0xff0000 |
                  (file->header).seqnum.super___atomic_base<unsigned_long>._M_i >> 0x28 & 0xff00 |
                  (file->header).seqnum.super___atomic_base<unsigned_long>._M_i >> 0x38;
      if (file->sb != (superblock *)0x0) {
        *(uint64_t *)((long)__dest + ((ulong)file->blocksize - 0x23)) =
             bmp_revnum >> 0x38 | (bmp_revnum & 0xff000000000000) >> 0x28 |
             (bmp_revnum & 0xff0000000000) >> 0x18 | (bmp_revnum & 0xff00000000) >> 8 |
             (bmp_revnum & 0xff000000) << 8 | (bmp_revnum & 0xff0000) << 0x18 |
             (bmp_revnum & 0xff00) << 0x28 | bmp_revnum << 0x38;
      }
      lVar4 = (file->header).stat.deltasize;
      sVar12 = wal_get_datasize(file);
      lVar5 = (file->header).stat.deltasize;
      sVar13 = wal_get_datasize(file);
      lVar6 = (file->header).stat.deltasize;
      sVar14 = wal_get_datasize(file);
      lVar7 = (file->header).stat.deltasize;
      sVar15 = wal_get_datasize(file);
      iVar8 = (file->header).stat.deltasize;
      sVar16 = wal_get_datasize(file);
      iVar9 = (file->header).stat.deltasize;
      sVar17 = wal_get_datasize(file);
      iVar10 = (file->header).stat.deltasize;
      sVar18 = wal_get_datasize(file);
      iVar11 = (file->header).stat.deltasize;
      sVar19 = wal_get_datasize(file);
      *(ulong *)((long)__dest + ((ulong)file->blocksize - 0x1b)) =
           (ulong)(uint)((int)sVar19 + (int)iVar11) << 0x38 |
           ((ulong)(uint)((int)sVar18 + (int)iVar10) & 0xff00) << 0x28 |
           ((ulong)(uint)((int)sVar17 + (int)iVar9) & 0xff0000) << 0x18 |
           ((ulong)(uint)((int)sVar16 + (int)iVar8) & 0xff000000) << 8 |
           (ulong)((uint)(sVar15 + lVar7 >> 8) & 0xff000000) |
           (ulong)((uint)(sVar14 + lVar6 >> 0x18) & 0xff0000) |
           (ulong)((uint)(sVar13 + lVar5 >> 0x28) & 0xff00) | sVar12 + lVar4 >> 0x38;
      (file->header).stat.deltasize = 0;
      if (pkVar3 != (kvs_header *)0x0) {
        node = avl_first(pkVar3->idx_id);
        while (node != (avl_node *)0x0) {
          paVar20 = avl_next(node);
          node[-2].right = (avl_node *)0x0;
          node = paVar20;
        }
      }
      uVar23 = (file->header).bid.super___atomic_base<unsigned_long>._M_i;
      *(ulong *)((long)__dest + ((ulong)file->blocksize - 0x13)) =
           uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 | (uVar23 & 0xff0000000000) >> 0x18
           | (uVar23 & 0xff00000000) >> 8 | (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18
           | (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
      *(ushort *)((long)__dest + ((ulong)file->blocksize - 0xb)) = uVar1 << 8 | uVar1 >> 8;
      *(ulong *)((long)__dest + ((ulong)file->blocksize - 9)) =
           uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 | (uVar21 & 0xff0000000000) >> 0x18
           | (uVar21 & 0xff00000000) >> 8 | (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18
           | (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
      *(undefined1 *)((long)__dest + ((ulong)file->blocksize - 1)) = 0xee;
      if (bid == 0xffffffffffffffff) {
        start_bid = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
      }
      else {
        bcache_invalidate_block(file,bid);
        start_bid = bid;
      }
      uVar21 = filemgr_write_blocks(file,__dest,1,start_bid);
      _log_errno_str(file->ops,log_callback,(fdb_status)uVar21,"WRITE",file->filename);
      uVar24 = (ulong)file->blocksize;
      if (uVar21 == uVar24) {
        if (uVar23 != 0) {
          filemgr_add_stale_block(file,uVar23 * uVar24,uVar24);
        }
        LOCK();
        (file->header).bid.super___atomic_base<unsigned_long>._M_i = start_bid;
        UNLOCK();
        if (bid == 0xffffffffffffffff) {
          LOCK();
          (file->pos).super___atomic_base<unsigned_long>._M_i =
               (file->pos).super___atomic_base<unsigned_long>._M_i + (ulong)file->blocksize;
          UNLOCK();
        }
        _filemgr_release_temp_buf(__dest);
      }
      else {
        _filemgr_release_temp_buf(__dest);
        pthread_spin_unlock(__lock);
        LOCK();
        (file->io_in_prog).super___atomic_base<unsigned_char>._M_i =
             (file->io_in_prog).super___atomic_base<unsigned_char>._M_i + 0xff;
        UNLOCK();
        bid = 0xfffffffc;
        if ((long)uVar21 < 0) {
          bid = uVar21 & 0xffffffff;
        }
      }
      if (uVar21 != uVar24) {
        return (fdb_status)bid;
      }
    }
    if ((((file->sb == (superblock *)0x0) ||
         ((file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i == 0)) ||
        ((file->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i == 0xffffffffffffffff))
       || ((file->status).super___atomic_base<unsigned_char>._M_i != '\0')) {
      LOCK();
      (file->last_commit).super___atomic_base<unsigned_long>._M_i =
           (file->pos).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
    }
    else {
      LOCK();
      (file->last_commit).super___atomic_base<unsigned_long>._M_i =
           (ulong)file->blocksize *
           (file->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      if (sb_ops.get_bmp_revnum == (_func_uint64_t_filemgr_ptr *)0x0 ||
          file->sb == (superblock *)0x0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (*sb_ops.get_bmp_revnum)(file);
      }
      LOCK();
      (file->last_writable_bmp_revnum).super___atomic_base<unsigned_long>._M_i = uVar22;
      UNLOCK();
    }
    pthread_spin_unlock(__lock);
    io_error = FDB_RESULT_SUCCESS;
    if (sync) {
      io_error = (*file->ops->fsync)(file->fd);
      _log_errno_str(file->ops,log_callback,io_error,"FSYNC",file->filename);
    }
    LOCK();
    (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var2;
    UNLOCK();
  }
  else {
    _log_errno_str(file->ops,log_callback,io_error,"FLUSH",file->filename);
  }
  LOCK();
  (file->io_in_prog).super___atomic_base<unsigned_char>._M_i =
       (file->io_in_prog).super___atomic_base<unsigned_char>._M_i + 0xff;
  UNLOCK();
  return io_error;
}

Assistant:

fdb_status filemgr_commit_bid(struct filemgr *file, bid_t bid,
                              uint64_t bmp_revnum, bool sync,
                              err_log_callback *log_callback)
{
    struct avl_node *a;
    struct kvs_node *node;
    bid_t prev_bid, _prev_bid;
    uint64_t _deltasize, _bmp_revnum;
    fdb_seqnum_t _seqnum;
    filemgr_header_revnum_t _revnum;
    int result = FDB_RESULT_SUCCESS;
    bool block_reusing = false;

    filemgr_set_io_inprog(file);
    uint64_t exp_filesize = atomic_get_uint64_t(&file->pos);
    if (global_config.ncacheblock > 0) {
        result = bcache_flush(file);
        if (result != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status) result,
                           "FLUSH", file->filename);
            filemgr_clear_io_inprog(file);
            return (fdb_status)result;
        }
    }

    spin_lock(&file->lock);

    uint16_t header_len = file->header.size;
    struct kvs_header *kv_header = file->kv_header;
    filemgr_magic_t magic = file->version;

    if (file->header.size > 0 && file->header.data) {
        void *buf = _filemgr_get_temp_buf();
        uint8_t marker[BLK_MARKER_SIZE];

        // [header data]:        'header_len' bytes   <---+
        // [header revnum]:      8 bytes                  |
        // [default KVS seqnum]: 8 bytes                  |
        // ...                                            |
        // (empty)                                    blocksize
        // ...                                            |
        // [SB bitmap revnum]:   8 bytes                  |
        // [Delta size]:         8 bytes                  |
        // [prev header bid]:    8 bytes                  |
        // [header length]:      2 bytes                  |
        // [magic number]:       8 bytes                  |
        // [block marker]:       1 byte               <---+

        // header data
        memcpy(buf, file->header.data, header_len);
        // header rev number
        _revnum = _endian_encode(file->header.revnum);
        memcpy((uint8_t *)buf + header_len, &_revnum,
               sizeof(filemgr_header_revnum_t));
        // file's sequence number (default KVS seqnum)
        _seqnum = _endian_encode(file->header.seqnum.load());
        memcpy((uint8_t *)buf + header_len + sizeof(filemgr_header_revnum_t),
               &_seqnum, sizeof(fdb_seqnum_t));

        // current header's sb bmp revision number
        if (file->sb) {
            _bmp_revnum = _endian_encode(bmp_revnum);
            memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
                   - sizeof(header_len) - sizeof(_prev_bid)
                   - sizeof(_deltasize) - sizeof(_bmp_revnum)
                   - BLK_MARKER_SIZE),
                   &_bmp_revnum, sizeof(_bmp_revnum));
        }

        // delta size since prior commit
        _deltasize = _endian_encode(file->header.stat.deltasize //index+data
                                  + wal_get_datasize(file)); // wal datasize
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - sizeof(_prev_bid)*2 - BLK_MARKER_SIZE),
               &_deltasize, sizeof(_deltasize));

        // Reset in-memory delta size of the header for next commit...
        file->header.stat.deltasize = 0; // single kv store header
        if (kv_header) { // multi kv store stats
            a = avl_first(kv_header->idx_id);
            while (a) {
                node = _get_entry(a, struct kvs_node, avl_id);
                a = avl_next(&node->avl_id);
                node->stat.deltasize = 0;
            }
        }

        // prev header bid
        prev_bid = atomic_get_uint64_t(&file->header.bid);
        _prev_bid = _endian_encode(prev_bid);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - sizeof(_prev_bid) - BLK_MARKER_SIZE),
               &_prev_bid, sizeof(_prev_bid));
        // header length
        header_len = _endian_encode(header_len);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - sizeof(header_len) - BLK_MARKER_SIZE),
               &header_len, sizeof(header_len));
        // magic number
        magic = _endian_encode(magic);
        memcpy((uint8_t *)buf + (file->blocksize - sizeof(filemgr_magic_t)
               - BLK_MARKER_SIZE), &magic, sizeof(magic));

        // marker
        memset(marker, BLK_MARKER_DBHEADER, BLK_MARKER_SIZE);
        memcpy((uint8_t *)buf + file->blocksize - BLK_MARKER_SIZE,
               marker, BLK_MARKER_SIZE);

        if (bid == BLK_NOT_FOUND) {
            // append header at the end of file
            bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
            block_reusing = false;
        } else {
            // write header in the allocated (reused) block
            block_reusing = true;
            // we MUST invalidate the header block 'bid', since previous
            // contents of 'bid' may remain in block cache and cause data
            // inconsistency if reading header block hits the cache.
            bcache_invalidate_block(file, bid);
        }

        ssize_t rv = filemgr_write_blocks(file, buf, 1, bid);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv,
                       "WRITE", file->filename);
        if (rv != (ssize_t)file->blocksize) {
            _filemgr_release_temp_buf(buf);
            spin_unlock(&file->lock);
            filemgr_clear_io_inprog(file);
            return rv < 0 ? (fdb_status) rv : FDB_RESULT_WRITE_FAIL;
        }

        if (prev_bid) {
            // mark prev DB header as stale
            filemgr_add_stale_block(file, prev_bid * file->blocksize, file->blocksize);
        }

        atomic_store_uint64_t(&file->header.bid, bid);
        if (!block_reusing) {
            atomic_add_uint64_t(&file->pos, file->blocksize);
        }

        _filemgr_release_temp_buf(buf);
    }

    if (sb_bmp_exists(file->sb) &&
        atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND &&
        atomic_get_uint8_t(&file->status) == FILE_NORMAL) {
        // block reusing is currently enabled
        atomic_store_uint64_t(&file->last_commit,
            atomic_get_uint64_t(&file->sb->cur_alloc_bid) * file->blocksize);
        // Since some more blocks may be allocated after the header block
        // (for storing BMP data or system docs for stale info)
        // so that the block pointed to by 'cur_alloc_bid' may have
        // different BMP revision number. So we have to use the
        // up-to-date bmp_revnum here.
        atomic_store_uint64_t(&file->last_writable_bmp_revnum,
                              filemgr_get_sb_bmp_revnum(file));
    } else {
        atomic_store_uint64_t(&file->last_commit, atomic_get_uint64_t(&file->pos));
        // WARNING: if `last_commit` is at the end of file,
        //          we should NOT update `last_writable_bmp_revnum`.
    }

    spin_unlock(&file->lock);

    if (sync) {
        result = file->ops->fsync(file->fd);
        _log_errno_str(file->ops, log_callback, (fdb_status)result,
                       "FSYNC", file->filename);
    }
    atomic_init_uint64_t(&file->latest_filesize, exp_filesize);

    filemgr_clear_io_inprog(file);
    return (fdb_status) result;
}